

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsKeyPressed(ImGuiKey key,ImGuiInputFlags flags,ImGuiID owner_id)

{
  bool bVar1;
  int iVar2;
  uint in_ESI;
  double key_pressed_time;
  ImGuiContext *g;
  float repeat_rate;
  float repeat_delay;
  bool pressed;
  float t;
  ImGuiKeyData *key_data;
  ImGuiKey in_stack_ffffffffffffffc4;
  double in_stack_ffffffffffffffc8;
  ImGuiKey key_00;
  ImGuiContext *in_stack_ffffffffffffffd0;
  float local_28;
  float local_24;
  bool local_1d;
  float local_1c;
  ImGuiKeyData *local_18;
  uint local_c;
  bool local_1;
  
  local_c = in_ESI;
  local_18 = GetKeyData(in_stack_ffffffffffffffc4);
  key_00 = (ImGuiKey)in_stack_ffffffffffffffd0;
  if ((local_18->Down & 1U) == 0) {
    local_1 = false;
  }
  else {
    local_1c = local_18->DownDuration;
    if (0.0 <= local_1c) {
      if ((local_c & 0xfe) != 0) {
        local_c = local_c | 1;
      }
      local_1d = local_1c == 0.0;
      if ((!local_1d) && ((local_c & 1) != 0)) {
        GetTypematicRepeatRate(local_c,&local_24,&local_28);
        bVar1 = false;
        if (local_24 < local_1c) {
          iVar2 = GetKeyPressedAmount((ImGuiKey)in_stack_ffffffffffffffd0,
                                      (float)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                                      SUB84(in_stack_ffffffffffffffc8,0));
          bVar1 = 0 < iVar2;
        }
        local_1d = bVar1;
        if ((local_1d != false) && ((local_c & 0xf0) != 0)) {
          in_stack_ffffffffffffffc8 = (GImGui->Time - (double)local_1c) + 9.999999747378752e-06;
          if (((local_c & 0x20) != 0) && (in_stack_ffffffffffffffc8 < GImGui->LastKeyModsChangeTime)
             ) {
            local_1d = false;
          }
          if (((local_c & 0x40) != 0) &&
             (in_stack_ffffffffffffffc8 < GImGui->LastKeyModsChangeFromNoneTime)) {
            local_1d = false;
          }
          in_stack_ffffffffffffffd0 = GImGui;
          if (((local_c & 0x80) != 0) &&
             (in_stack_ffffffffffffffc8 < GImGui->LastKeyboardKeyPressTime)) {
            local_1d = false;
          }
        }
        key_00 = (ImGuiKey)in_stack_ffffffffffffffd0;
      }
      if (local_1d == false) {
        local_1 = false;
      }
      else {
        bVar1 = TestKeyOwner(key_00,(ImGuiID)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
        if (bVar1) {
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool ImGui::IsKeyPressed(ImGuiKey key, ImGuiInputFlags flags, ImGuiID owner_id)
{
    const ImGuiKeyData* key_data = GetKeyData(key);
    if (!key_data->Down) // In theory this should already be encoded as (DownDuration < 0.0f), but testing this facilitates eating mechanism (until we finish work on key ownership)
        return false;
    const float t = key_data->DownDuration;
    if (t < 0.0f)
        return false;
    IM_ASSERT((flags & ~ImGuiInputFlags_SupportedByIsKeyPressed) == 0); // Passing flags not supported by this function!
    if (flags & (ImGuiInputFlags_RepeatRateMask_ | ImGuiInputFlags_RepeatUntilMask_)) // Setting any _RepeatXXX option enables _Repeat
        flags |= ImGuiInputFlags_Repeat;

    bool pressed = (t == 0.0f);
    if (!pressed && (flags & ImGuiInputFlags_Repeat) != 0)
    {
        float repeat_delay, repeat_rate;
        GetTypematicRepeatRate(flags, &repeat_delay, &repeat_rate);
        pressed = (t > repeat_delay) && GetKeyPressedAmount(key, repeat_delay, repeat_rate) > 0;
        if (pressed && (flags & ImGuiInputFlags_RepeatUntilMask_))
        {
            // Slightly bias 'key_pressed_time' as DownDuration is an accumulation of DeltaTime which we compare to an absolute time value.
            // Ideally we'd replace DownDuration with KeyPressedTime but it would break user's code.
            ImGuiContext& g = *GImGui;
            double key_pressed_time = g.Time - t + 0.00001f;
            if ((flags & ImGuiInputFlags_RepeatUntilKeyModsChange) && (g.LastKeyModsChangeTime > key_pressed_time))
                pressed = false;
            if ((flags & ImGuiInputFlags_RepeatUntilKeyModsChangeFromNone) && (g.LastKeyModsChangeFromNoneTime > key_pressed_time))
                pressed = false;
            if ((flags & ImGuiInputFlags_RepeatUntilOtherKeyPress) && (g.LastKeyboardKeyPressTime > key_pressed_time))
                pressed = false;
        }
    }
    if (!pressed)
        return false;
    if (!TestKeyOwner(key, owner_id))
        return false;
    return true;
}